

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O0

int csp_eth_rx(csp_iface_t *iface,csp_eth_header_t *eth_frame,uint32_t received_len,int *task_woken)

{
  __uint16_t _Var1;
  int iVar2;
  csp_packet_t *packet_00;
  csp_packet_t *in_RCX;
  uint in_EDX;
  long in_RSI;
  uint16_t *in_RDI;
  csp_packet_t *packet;
  uint16_t frame_length;
  uint16_t seg_size;
  uint32_t packet_id;
  csp_eth_interface_data_t *ifdata;
  csp_packet_t *in_stack_ffffffffffffffb8;
  uint32_t *in_stack_ffffffffffffffc0;
  uint16_t uVar3;
  ushort uVar4;
  undefined2 uVar5;
  uint16_t csp_addr;
  uint8_t *mac_addr;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  mac_addr = *(uint8_t **)(in_RDI + 8);
  if (eth_debug) {
    csp_hex_dump((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
  }
  _Var1 = __bswap_16(*(__uint16_t *)(in_RSI + 0xc));
  if (_Var1 == 0x88b5) {
    if (in_EDX < 0x16) {
      *(int *)(in_RDI + 0x22) = *(int *)(in_RDI + 0x22) + 1;
      local_4 = -2;
    }
    else {
      uVar5 = 0;
      csp_addr = 0;
      uVar4 = 0;
      uVar3 = 0;
      csp_if_eth_unpack_header
                ((csp_eth_header_t *)0x0,in_stack_ffffffffffffffc0,
                 (uint16_t *)in_stack_ffffffffffffffb8,(uint16_t *)0x11418d);
      if ((uVar4 == 0) || (0x5dc < uVar4)) {
        *(int *)(in_RDI + 0x22) = *(int *)(in_RDI + 0x22) + 1;
        csp_print_func("eth rx seg_size of %u bytes is invalid\n");
        local_4 = -2;
      }
      else if (uVar3 < uVar4) {
        *(int *)(in_RDI + 0x22) = *(int *)(in_RDI + 0x22) + 1;
        csp_print_func("eth rx seg_size(%u) > frame_length(%u)\n",(ulong)uVar4,(ulong)uVar3);
        local_4 = -2;
      }
      else if (in_EDX < uVar4 + 0x16) {
        *(int *)(in_RDI + 0x22) = *(int *)(in_RDI + 0x22) + 1;
        csp_print_func("eth rx sizeof(csp_eth_frame_t) + seg_size(%u) > received(%u)\n",(ulong)uVar4
                       ,(ulong)in_EDX);
        local_4 = -2;
      }
      else if ((uVar3 == 0) || (0x100 < uVar3)) {
        *(int *)(in_RDI + 0x22) = *(int *)(in_RDI + 0x22) + 1;
        csp_print_func("eth rx frame_length of %u is invalid\n",(ulong)uVar3);
        local_4 = -2;
      }
      else {
        packet_00 = csp_eth_pbuf_find((csp_eth_interface_data_t *)in_RCX,
                                      (uint32_t)((ulong)mac_addr >> 0x20),
                                      (int *)CONCAT26(csp_addr,CONCAT24(uVar5,CONCAT22(uVar4,uVar3))
                                                     ));
        if (packet_00 == (csp_packet_t *)0x0) {
          *(int *)(in_RDI + 0x1e) = *(int *)(in_RDI + 0x1e) + 1;
          csp_print_func("eth rx cannot get csp packet\n");
          local_4 = -2;
        }
        else {
          if (packet_00->frame_length == 0) {
            csp_id_setup_rx(in_stack_ffffffffffffffb8);
            packet_00->frame_length = uVar3;
            packet_00->rx_count = 0;
          }
          iVar2 = (int)((ulong)mac_addr >> 0x20);
          if (uVar3 == packet_00->frame_length) {
            if ((uint)packet_00->frame_length < (uint)packet_00->rx_count + (uint)uVar4) {
              csp_eth_pbuf_free((csp_eth_interface_data_t *)
                                CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,iVar2,
                                (int *)CONCAT26(csp_addr,CONCAT24(uVar5,CONCAT22(uVar4,uVar3))));
              *(int *)(in_RDI + 0x22) = *(int *)(in_RDI + 0x22) + 1;
              csp_print_func("eth rx data received exceeds frame_length\n");
              local_4 = -2;
            }
            else {
              memcpy(packet_00->frame_begin + (int)(uint)packet_00->rx_count,(void *)(in_RSI + 0x16)
                     ,(ulong)uVar4);
              packet_00->rx_count = packet_00->rx_count + uVar4;
              if (packet_00->rx_count < packet_00->frame_length) {
                local_4 = 0;
              }
              else {
                csp_eth_pbuf_free((csp_eth_interface_data_t *)
                                  CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,
                                  (int)((ulong)mac_addr >> 0x20),
                                  (int *)CONCAT26(csp_addr,CONCAT24(uVar5,CONCAT22(uVar4,uVar3))));
                iVar2 = csp_id_strip(in_stack_ffffffffffffffb8);
                if (iVar2 == 0) {
                  csp_eth_arp_set_addr(mac_addr,csp_addr);
                  if (((packet_00->id).dst == *in_RDI) || ((mac_addr[0x60] & 1) != 0)) {
                    csp_qfifo_write((csp_packet_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                                    (csp_iface_t *)in_RCX,mac_addr);
                    local_4 = 0;
                  }
                  else {
                    csp_eth_pbuf_free((csp_eth_interface_data_t *)
                                      CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,
                                      (int)((ulong)mac_addr >> 0x20),
                                      (int *)CONCAT26(csp_addr,CONCAT24(uVar5,CONCAT22(uVar4,uVar3))
                                                     ));
                    if (in_RCX == (csp_packet_t *)0x0) {
                      csp_buffer_free(packet_00);
                    }
                    else {
                      csp_buffer_free_isr(packet_00);
                    }
                    local_4 = 0;
                  }
                }
                else {
                  csp_print_func("eth rx packet discarded due to error in ID field\n");
                  *(int *)(in_RDI + 0x22) = *(int *)(in_RDI + 0x22) + 1;
                  if (in_RCX == (csp_packet_t *)0x0) {
                    csp_buffer_free(packet_00);
                  }
                  else {
                    csp_buffer_free_isr(packet_00);
                  }
                  local_4 = -2;
                }
              }
            }
          }
          else {
            csp_eth_pbuf_free((csp_eth_interface_data_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0)
                              ,in_RCX,iVar2,
                              (int *)CONCAT26(csp_addr,CONCAT24(uVar5,CONCAT22(uVar4,uVar3))));
            *(int *)(in_RDI + 0x22) = *(int *)(in_RDI + 0x22) + 1;
            csp_print_func("eth rx inconsistent frame_length\n");
            local_4 = -2;
          }
        }
      }
    }
  }
  else {
    *(int *)(in_RDI + 0x22) = *(int *)(in_RDI + 0x22) + 1;
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int csp_eth_rx(csp_iface_t * iface, csp_eth_header_t * eth_frame, uint32_t received_len, int * task_woken) {

	csp_eth_interface_data_t * ifdata = iface->interface_data;

    if (eth_debug) csp_hex_dump("rx", (void*)eth_frame, received_len);

    /* Filter on CSP protocol id */
    if ((be16toh(eth_frame->ether_type) != CSP_ETH_TYPE_CSP)) {
        iface->frame++;
        return CSP_ERR_INVAL;
    }

    if (received_len < sizeof(csp_eth_header_t)) {
        iface->frame++;
        return CSP_ERR_INVAL;
    }

    /* Packet ID on RX side is a concatenation of packet ID on TX side and the source address */
    uint32_t packet_id = 0;
    uint16_t seg_size = 0;
    uint16_t frame_length = 0;
    csp_if_eth_unpack_header(eth_frame, &packet_id, &seg_size, &frame_length);

    if (seg_size == 0 || seg_size > CSP_ETH_FRAME_SIZE_MAX) {
        iface->frame++;
        csp_print("eth rx seg_size of %u bytes is invalid\n");
        return CSP_ERR_INVAL;
    }

    if (seg_size > frame_length) {
        iface->frame++;
        csp_print("eth rx seg_size(%u) > frame_length(%u)\n", (unsigned)seg_size, (unsigned)frame_length);
        return CSP_ERR_INVAL;
    }

    if ((sizeof(csp_eth_header_t) + seg_size) > received_len) {
        iface->frame++;
        csp_print("eth rx sizeof(csp_eth_frame_t) + seg_size(%u) > received(%u)\n",
            (unsigned)seg_size, (unsigned)received_len);
        return CSP_ERR_INVAL;
    }

    if (frame_length == 0 || frame_length > CSP_BUFFER_SIZE) {
        iface->frame++;
        csp_print("eth rx frame_length of %u is invalid\n", frame_length);
        return CSP_ERR_INVAL;
    }

    csp_packet_t * packet = csp_eth_pbuf_find(ifdata, packet_id, task_woken);

    if (packet == NULL) {
        iface->drop++;
        csp_print("eth rx cannot get csp packet\n");
        return CSP_ERR_INVAL;
    }

    if (packet->frame_length == 0) {
        /* First segment */
        csp_id_setup_rx(packet);
        packet->frame_length = frame_length;
        packet->rx_count = 0;
    }

    if (frame_length != packet->frame_length) {
        csp_eth_pbuf_free(ifdata, packet, true, task_woken);
        iface->frame++;
        csp_print("eth rx inconsistent frame_length\n");
        return CSP_ERR_INVAL;
    }

    if ((packet->rx_count + seg_size) > packet->frame_length) {
        csp_eth_pbuf_free(ifdata, packet, true, task_woken);
        iface->frame++;
        csp_print("eth rx data received exceeds frame_length\n");
        return CSP_ERR_INVAL;
    }

    memcpy(packet->frame_begin + packet->rx_count, eth_frame->frame_begin, seg_size);
    packet->rx_count += seg_size;

    /* Send packet when fully received */
    if (packet->rx_count < packet->frame_length) {
        return CSP_ERR_NONE;
    }

    csp_eth_pbuf_free(ifdata, packet, false, task_woken);

    if (csp_id_strip(packet) != 0) {
        csp_print("eth rx packet discarded due to error in ID field\n");
        iface->frame++;
        (task_woken) ? csp_buffer_free_isr(packet) : csp_buffer_free(packet);
        return CSP_ERR_INVAL;
    }

    /* Record CSP and MAC addresses of source */
    csp_eth_arp_set_addr(eth_frame->ether_shost, packet->id.src);

    if (packet->id.dst != iface->addr && !ifdata->promisc) {
        csp_eth_pbuf_free(ifdata, packet, true, task_woken);
        (task_woken) ? csp_buffer_free_isr(packet) : csp_buffer_free(packet);
        return CSP_ERR_NONE;
    }

    csp_qfifo_write(packet, iface, task_woken);

    return CSP_ERR_NONE;
}